

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

bool __thiscall FTraceInfo::TraceTraverse(FTraceInfo *this,int ptflags)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  extsector_t *peVar4;
  F3DFloor **ppFVar5;
  F3DFloor *pFVar6;
  AActor *this_00;
  FTraceResults *pFVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  intercept_t *in;
  line_t_conflict *plVar16;
  FLinePortal *pFVar17;
  sector_t_conflict *psVar18;
  FTraceResults *res;
  long lVar19;
  FTraceResults *pFVar20;
  double dist;
  double dVar21;
  sector_t *psVar22;
  double dVar23;
  DVector2 local_198;
  DVector3 local_188;
  DVector3 local_168;
  FPathTraverse it;
  FTraceResults hsecResult;
  
  Setup3DFloors(this);
  FPathTraverse::FPathTraverse
            (&it,(this->Start).X,(this->Start).Y,(this->Vec).X * this->MaxDist,
             this->MaxDist * (this->Vec).Y,ptflags | 8,this->startfrac);
  iVar15 = -1;
LAB_0045a04d:
  in = FPathTraverse::Next(&it);
  if (in == (intercept_t *)0x0) goto LAB_0045a428;
  if ((this->Results->Crossed3DWater == (F3DFloor *)0x0) && (iVar15 != this->CurSector->sectornum))
  {
    peVar4 = this->CurSector->e;
    ppFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    uVar3 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    for (lVar19 = 0; (ulong)uVar3 << 3 != lVar19; lVar19 = lVar19 + 8) {
      pFVar6 = *(F3DFloor **)((long)ppFVar5 + lVar19);
      if (((~pFVar6->flags & 0x11) == 0) && (bVar13 = CheckPlane(this,(pFVar6->top).plane), bVar13))
      {
        hsecResult.Sector = (sector_t *)(this->Results->HitPos).X;
        hsecResult._8_8_ = (this->Results->HitPos).Y;
        dVar23 = secplane_t::ZatPoint((pFVar6->top).plane,(DVector2 *)&hsecResult);
        local_198.X = (this->Results->HitPos).X;
        local_198.Y = (this->Results->HitPos).Y;
        dVar9 = secplane_t::ZatPoint(&this->CurSector->floorplane,&local_198);
        if (dVar9 < dVar23) {
          pFVar20 = this->Results;
          pFVar20->Crossed3DWater = pFVar6;
          (pFVar20->Crossed3DWaterPos).Z = (pFVar20->HitPos).Z;
          uVar10 = *(undefined4 *)((long)&(pFVar20->HitPos).X + 4);
          uVar11 = *(undefined4 *)&(pFVar20->HitPos).Y;
          uVar12 = *(undefined4 *)((long)&(pFVar20->HitPos).Y + 4);
          *(undefined4 *)&(pFVar20->Crossed3DWaterPos).X = *(undefined4 *)&(pFVar20->HitPos).X;
          *(undefined4 *)((long)&(pFVar20->Crossed3DWaterPos).X + 4) = uVar10;
          *(undefined4 *)&(pFVar20->Crossed3DWaterPos).Y = uVar11;
          *(undefined4 *)((long)&(pFVar20->Crossed3DWaterPos).Y + 4) = uVar12;
          pFVar20->Distance = 0.0;
        }
      }
    }
    iVar15 = this->CurSector->sectornum;
  }
  dVar23 = this->MaxDist;
  dist = in->frac * dVar23;
  dVar9 = (this->Vec).Z;
  dVar1 = (this->Start).Z;
  dVar21 = dist * dVar9 + dVar1;
  if ((0.0 <= dVar9) || (psVar18 = this->CurSector, (psVar18->planes[0].Flags & 0x1d0U) != 0x100)) {
    if ((0.0 < dVar9) &&
       (((psVar18 = this->CurSector, (psVar18->planes[1].Flags & 0x1d0U) == 0x100 &&
         (dVar2 = sectorPortals.Array[psVar18->Portals[1]].mPlaneZ, dVar2 < dVar21)) &&
        (this->limitz <= dVar2 && dVar2 != this->limitz)))) {
      this->limitz = dVar2;
      EnterSectorPortal(this,&it,1,(dVar2 - dVar1) / (dVar23 * dVar9),psVar18);
      goto LAB_0045a04d;
    }
  }
  else {
    dVar2 = sectorPortals.Array[psVar18->Portals[0]].mPlaneZ;
    if ((dVar21 < dVar2) && (dVar2 < this->limitz)) {
      this->limitz = dVar2;
      EnterSectorPortal(this,&it,0,(dVar2 - dVar1) / (dVar23 * dVar9),psVar18);
      goto LAB_0045a04d;
    }
  }
  psVar22 = (sector_t *)((this->Vec).X * dist + (this->Start).X);
  dVar23 = (this->Vec).Y * dist + (this->Start).Y;
  this_00 = (in->d).thing;
  if (in->isaline == true) {
    bVar13 = line_t::isLinePortal((line_t *)this_00);
    if (bVar13) {
      hsecResult.Sector = (sector_t *)(this->Start).X;
      hsecResult._8_8_ = (this->Start).Y;
      iVar14 = P_PointOnLineSidePrecise((DVector2 *)&hsecResult,(in->d).line);
      if (iVar14 == 0) {
        plVar16 = (in->d).line;
        psVar18 = plVar16->backsector;
        if (psVar18 != (sector_t_conflict *)0x0) {
          hsecResult.Sector = psVar22;
          hsecResult._8_8_ = dVar23;
          dVar9 = secplane_t::ZatPoint(&psVar18->floorplane,(DVector2 *)&hsecResult);
          if ((dVar21 < dVar9) ||
             (local_198.X = (double)psVar22, local_198.Y = dVar23,
             dVar9 = secplane_t::ZatPoint(&psVar18->ceilingplane,&local_198), dVar9 < dVar21))
          goto LAB_0045a384;
          plVar16 = (in->d).line;
        }
        pFVar17 = linePortals.Array + plVar16->portalindex;
        if (linePortals.Count <= plVar16->portalindex) {
          pFVar17 = (FLinePortal *)0x0;
        }
        if ((pFVar17->mType == '\x03') || ((this->TraceFlags & 8) == 0)) {
          EnterLinePortal(this,&it,in);
          goto LAB_0045a04d;
        }
      }
    }
LAB_0045a384:
    local_168.X = (double)psVar22;
    local_168.Y = dVar23;
    local_168.Z = dVar21;
    bVar13 = LineCheck(this,in,dist,&local_168);
  }
  else {
    if ((((this->ActorMask).Value & (this_00->flags).Value) == 0) || (this_00 == this->IgnoreThis))
    goto LAB_0045a04d;
    local_188.X = (double)psVar22;
    local_188.Y = dVar23;
    local_188.Z = dVar21;
    bVar13 = ThingCheck(this,in,dist,&local_188);
  }
  if (bVar13 != false) goto LAB_0045a04d;
LAB_0045a428:
  pFVar20 = this->Results;
  psVar18 = this->CurSector;
  if (pFVar20->HitType != TRACE_HitNone) goto LAB_0045a4c2;
  if ((psVar18->planes[0].Flags & 0x1d0U) == 0x100) {
LAB_0045a47c:
    if ((psVar18->planes[1].Flags & 0x1d0U) == 0x100) {
      pFVar20 = this->Results;
      goto LAB_0045a4c2;
    }
    bVar13 = CheckPlane(this,&psVar18->ceilingplane);
    pFVar20 = this->Results;
    psVar18 = this->CurSector;
    if (!bVar13) goto LAB_0045a4c2;
    pFVar20->HitType = TRACE_HitCeiling;
    iVar15 = psVar18->planes[1].Texture.texnum;
  }
  else {
    bVar13 = CheckPlane(this,&psVar18->floorplane);
    psVar18 = this->CurSector;
    if (!bVar13) goto LAB_0045a47c;
    pFVar20 = this->Results;
    pFVar20->HitType = TRACE_HitFloor;
    iVar15 = psVar18->planes[0].Texture.texnum;
  }
  (pFVar20->HitTexture).texnum = iVar15;
LAB_0045a4c2:
  pFVar20->Sector = (sector_t *)(sectors + psVar18->sectornum);
  if ((pFVar20->CrossedWater == (sector_t *)0x0) && (psVar18->heightsec != (sector_t_conflict *)0x0)
     ) {
    hsecResult.Sector = (sector_t *)(this->Start).X;
    hsecResult._8_8_ = (this->Start).Y;
    dVar23 = secplane_t::ZatPoint(&psVar18->heightsec->floorplane,(DVector2 *)&hsecResult);
    pFVar20 = this->Results;
    if (dVar23 < (this->Start).Z) {
      local_198.X = (pFVar20->HitPos).X;
      local_198.Y = (pFVar20->HitPos).Y;
      dVar23 = secplane_t::ZatPoint(&this->CurSector->heightsec->floorplane,&local_198);
      pFVar20 = this->Results;
      if ((pFVar20->HitPos).Z <= dVar23) {
        this->Results = &hsecResult;
        bVar13 = CheckPlane(this,&this->CurSector->heightsec->floorplane);
        if (bVar13) {
          pFVar7 = this->Results;
          pFVar7->CrossedWater = (sector_t *)(sectors + this->CurSector->sectornum);
          (pFVar7->CrossedWaterPos).Z = (pFVar7->HitPos).Z;
          dVar23 = (pFVar7->HitPos).Y;
          (pFVar7->CrossedWaterPos).X = (pFVar7->HitPos).X;
          (pFVar7->CrossedWaterPos).Y = dVar23;
          pFVar7->Distance = 0.0;
        }
        this->Results = pFVar20;
      }
    }
  }
  bVar13 = true;
  if (pFVar20->HitType == TRACE_HitNone) {
    if ((pFVar20->Distance != 0.0) || (NAN(pFVar20->Distance))) {
      bVar13 = false;
    }
    else {
      dVar23 = this->MaxDist;
      dVar1 = (this->Vec).X;
      dVar9 = (this->Vec).Y;
      (pFVar20->HitPos).Z = (this->Vec).Z * dVar23 + (this->Start).Z;
      dVar1 = (this->Start).X + dVar1 * dVar23;
      dVar23 = (this->Start).Y + dVar23 * dVar9;
      auVar8._8_4_ = SUB84(dVar23,0);
      auVar8._0_8_ = dVar1;
      auVar8._12_4_ = (int)((ulong)dVar23 >> 0x20);
      (pFVar20->HitPos).X = dVar1;
      (pFVar20->HitPos).Y = (double)auVar8._8_8_;
      SetSourcePosition(this);
      pFVar20 = this->Results;
      pFVar20->Distance = this->MaxDist;
      pFVar20->Fraction = 1.0;
      bVar13 = pFVar20->HitType != TRACE_HitNone;
    }
  }
  FPathTraverse::~FPathTraverse(&it);
  return bVar13;
}

Assistant:

bool FTraceInfo::TraceTraverse (int ptflags)
{
	// Do a 3D floor check in the starting sector
	Setup3DFloors();

	FPathTraverse it(Start.X, Start.Y, Vec.X * MaxDist, Vec.Y * MaxDist, ptflags | PT_DELTA, startfrac);
	intercept_t *in;
	int lastsplashsector = -1;

	while ((in = it.Next()))
	{
		// Deal with splashes in 3D floors (but only run once per sector, not each iteration - and stop if something was found.)
		if (Results->Crossed3DWater == NULL && lastsplashsector != CurSector->sectornum)
		{
			for (auto rover : CurSector->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_EXISTS) && (rover->flags&FF_SWIMMABLE))
				{
					if (Check3DFloorPlane(rover, false))
					{
						// only consider if the plane is above the actual floor.
						if (rover->top.plane->ZatPoint(Results->HitPos) > CurSector->floorplane.ZatPoint(Results->HitPos))
						{
							Results->Crossed3DWater = rover;
							Results->Crossed3DWaterPos = Results->HitPos;
							Results->Distance = 0;
						}
					}
				}
			}
			lastsplashsector = CurSector->sectornum;
		}

		double dist = MaxDist * in->frac;
		DVector3 hit = Start + Vec * dist;

		// Crossed a floor portal? 
		if (Vec.Z < 0 && !CurSector->PortalBlocksMovement(sector_t::floor))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::floor);
			if (hit.Z < portz && limitz > portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::floor, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}
		// ... or a ceiling portal?
		else if (Vec.Z > 0 && !CurSector->PortalBlocksMovement(sector_t::ceiling))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::ceiling);
			if (hit.Z > portz && limitz < portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::ceiling, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}

		if (in->isaline)
		{
			if (in->d.line->isLinePortal() && P_PointOnLineSidePrecise(Start, in->d.line) == 0)
			{
				sector_t *entersector = in->d.line->backsector;
				if (entersector == NULL || (hit.Z >= entersector->floorplane.ZatPoint(hit) && hit.Z <= entersector->ceilingplane.ZatPoint(hit)))
				{
					FLinePortal *port = in->d.line->getPortal();
					// The caller cannot handle portals without global offset.
					if (port->mType == PORTT_LINKED || !(TraceFlags & TRACE_PortalRestrict))
					{
						EnterLinePortal(it, in);
						continue;
					}
				}
			}
			if (!LineCheck(in, dist, hit)) break;
		}
		else if ((in->d.thing->flags & ActorMask) && in->d.thing != IgnoreThis)
		{
			if (!ThingCheck(in, dist, hit)) break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		if (CurSector->PortalBlocksMovement(sector_t::floor) && CheckSectorPlane(CurSector, true))
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else if (CurSector->PortalBlocksMovement(sector_t::ceiling) && CheckSectorPlane(CurSector, false))
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
	}

	// check for intersection with floor/ceiling
	Results->Sector = &sectors[CurSector->sectornum];

	if (Results->CrossedWater == NULL &&
		CurSector->heightsec != NULL &&
		CurSector->heightsec->floorplane.ZatPoint(Start) < Start.Z &&
		CurSector->heightsec->floorplane.ZatPoint(Results->HitPos) >= Results->HitPos.Z)
	{
		// Save the result so that the water check doesn't destroy it.
		FTraceResults *res = Results;
		FTraceResults hsecResult;
		Results = &hsecResult;

		if (CheckSectorPlane(CurSector->heightsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
		Results = res;
	}
	if (Results->HitType == TRACE_HitNone && Results->Distance == 0)
	{
		Results->HitPos = Start + Vec * MaxDist;
		SetSourcePosition();
		Results->Distance = MaxDist;
		Results->Fraction = 1.;
	}
	return Results->HitType != TRACE_HitNone;
}